

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

void Realpath(string *path,string *resolved_path,string *errorMessage)

{
  int *piVar1;
  char *pcVar2;
  char resolved_name [4096];
  char acStack_1028 [4104];
  
  piVar1 = __errno_location();
  *piVar1 = 0;
  pcVar2 = realpath((path->_M_dataplus)._M_p,acStack_1028);
  if (pcVar2 == (char *)0x0) {
    if (errorMessage == (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)resolved_path);
      return;
    }
    if (*piVar1 != 0) {
      strerror(*piVar1);
    }
    std::__cxx11::string::assign((char *)errorMessage);
  }
  std::__cxx11::string::assign((char *)resolved_path);
  return;
}

Assistant:

inline void Realpath(const std::string& path, std::string& resolved_path,
                     std::string* errorMessage = 0)
{
  char resolved_name[KWSYS_SYSTEMTOOLS_MAXPATH];

  errno = 0;
  char* ret = realpath(path.c_str(), resolved_name);
  if (ret) {
    resolved_path = ret;
  } else if (errorMessage) {
    if (errno) {
      *errorMessage = strerror(errno);
    } else {
      *errorMessage = "Unknown error.";
    }

    resolved_path = "";
  } else {
    // if path resolution fails, return what was passed in
    resolved_path = path;
  }
}